

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScanDepFormat.cxx
# Opt level: O3

bool cmScanDepFormat_P1689_Parse(string *arg_pp,cmScanDepInfo *info)

{
  pointer pcVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  UInt UVar5;
  ArrayIndex AVar6;
  LookupMethod LVar7;
  Value *pVVar8;
  Value *pVVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  bool *pbVar13;
  _Elt_pointer ppVVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  undefined4 uVar16;
  undefined4 uVar18;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  int iVar20;
  int iVar23;
  int iVar24;
  undefined1 auVar21 [16];
  int iVar25;
  undefined1 auVar22 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int iVar47;
  int iVar51;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_XMM6 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar52 [16];
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_06;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_07;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_08;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_09;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_12;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_13;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_14;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_15;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_16;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_17;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_18;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_19;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_20;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_21;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_22;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_23;
  const_iterator cVar53;
  string extra_output;
  string wd;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  work_directory;
  string lookup_method_str;
  Reader reader;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *__range4;
  Value ppio;
  ifstream ppf;
  undefined1 local_498 [48];
  undefined1 local_468 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_440;
  Value *local_438;
  String local_430;
  char local_410;
  string local_408;
  SelfType local_3e8;
  undefined1 local_3d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  undefined1 local_3b8 [32];
  string local_398;
  undefined1 local_378 [32];
  undefined2 local_358;
  LookupMethod local_354;
  _Alloc_hider local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308 [3];
  _Alloc_hider local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  ValueIteratorBase local_2a8;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *local_298;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_290;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *local_288;
  SelfType local_280;
  Value local_270;
  SelfType local_248;
  istream local_238 [520];
  
  Json::Value::Value(&local_270,nullValue);
  std::ifstream::ifstream(local_238,(arg_pp->_M_dataplus)._M_p,_S_in|_S_bin);
  Json::Reader::Reader((Reader *)local_3b8);
  bVar3 = Json::Reader::parse((Reader *)local_3b8,local_238,&local_270,false);
  if (bVar3) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_p != &local_2c0) {
      operator_delete(local_2d0._M_p,local_2c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_p != local_308) {
      operator_delete(local_318._M_p,local_308[0]._M_allocated_capacity + 1);
    }
    std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
              ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)
               (local_378 + 0x10));
    std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
              ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)local_3b8);
    pVVar8 = Json::Value::operator[](&local_270,"version");
    UVar5 = Json::Value::asUInt(pVVar8);
    if (UVar5 < 2) {
      pVVar8 = Json::Value::operator[](&local_270,"rules");
      bVar3 = Json::Value::isArray(pVVar8);
      bVar12 = true;
      if (!bVar3) goto LAB_0053aad6;
      AVar6 = Json::Value::size(pVVar8);
      if (AVar6 == 1) {
        cVar53 = Json::Value::begin(pVVar8);
        local_2a8.current_ = cVar53.super_ValueIteratorBase.current_._M_node;
        local_2a8.isNull_ = cVar53.super_ValueIteratorBase.isNull_;
        cVar53 = Json::Value::end(pVVar8);
        local_248.current_ = cVar53.super_ValueIteratorBase.current_._M_node;
        local_248.isNull_ = cVar53.super_ValueIteratorBase.isNull_;
        local_290 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                    &info->ExtraOutputs;
        local_288 = &info->Provides;
        local_298 = &info->Requires;
        while (bVar3 = Json::ValueIteratorBase::isEqual(&local_2a8,&local_248), !bVar3) {
          local_438 = Json::ValueIteratorBase::deref(&local_2a8);
          local_410 = '\0';
          pVVar8 = Json::Value::operator[](local_438,"work-directory");
          bVar3 = Json::Value::isString(pVVar8);
          if (!bVar3) {
            bVar3 = Json::Value::isNull(pVVar8);
            if (bVar3) goto LAB_0053acdf;
            local_3b8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x26;
            local_3b8._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
            local_468._8_8_ = (arg_pp->_M_dataplus)._M_p;
            local_468._0_8_ = arg_pp->_M_string_length;
            cmStrCat<char[33]>((string *)local_498,(cmAlphaNum *)local_3b8,(cmAlphaNum *)local_468,
                               (char (*) [33])": work-directory is not a string");
            cmSystemTools::Error((string *)local_498);
LAB_0053c702:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_498 + 0x10)) {
              ppVVar14 = (_Elt_pointer)CONCAT71(local_498._17_7_,local_498[0x10]);
              paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_498._0_8_;
LAB_0053c59a:
              operator_delete(paVar15,(long)ppVVar14 + 1);
            }
LAB_0053c5a2:
            if ((local_410 != '\x01') ||
               (local_410 = '\0',
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_430._M_dataplus._M_p == &local_430.field_2)) goto LAB_0053aad4;
            goto LAB_0053a9d6;
          }
          local_468._0_8_ = local_468 + 0x10;
          local_468._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_468._16_8_ = local_468._16_8_ & 0xffffffffffffff00;
          bVar3 = ParseFilename(pVVar8,(string *)local_468);
          if (bVar3) {
            std::optional<std::__cxx11::string>::operator=
                      ((optional<std::__cxx11::string> *)&local_430,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_468);
          }
          else {
            local_3b8._24_8_ = (arg_pp->_M_dataplus)._M_p;
            local_3b8._16_8_ = arg_pp->_M_string_length;
            local_3b8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x26;
            local_3b8._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
            local_398._M_dataplus._M_p = (pointer)0xe;
            local_398._M_string_length = 0x7969da;
            views_01._M_len = 3;
            views_01._M_array = (iterator)local_3b8;
            cmCatViews_abi_cxx11_((string *)local_498,views_01);
            cmSystemTools::Error((string *)local_498);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_498 + 0x10)) {
              operator_delete((void *)local_498._0_8_,CONCAT71(local_498._17_7_,local_498[0x10]) + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_468 + 0x10)) {
            operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
          }
          if (!bVar3) goto LAB_0053c5a2;
LAB_0053acdf:
          bVar3 = Json::Value::isMember(local_438,"primary-output");
          if (bVar3) {
            pVVar8 = Json::Value::operator[](local_438,"primary-output");
            bVar3 = ParseFilename(pVVar8,&info->PrimaryOutput);
            if (bVar3) {
              if (((local_410 == '\x01') &&
                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_430._M_string_length !=
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0)) &&
                 (bVar3 = cmsys::SystemTools::FileIsFullPath(&info->PrimaryOutput), !bVar3)) {
                local_468._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x1;
                local_468._8_8_ = local_468 + 0x10;
                local_468[0x10] = 0x2f;
                local_3b8._0_8_ = local_430._M_string_length;
                local_3b8._8_8_ = local_430._M_dataplus._M_p;
                local_3b8._16_8_ = (_Elt_pointer)0x1;
                local_398._M_string_length = (size_type)(info->PrimaryOutput)._M_dataplus._M_p;
                local_398._M_dataplus._M_p = (pointer)(info->PrimaryOutput)._M_string_length;
                views_02._M_len = 3;
                views_02._M_array = (iterator)local_3b8;
                local_3b8._24_8_ = local_468._8_8_;
                cmCatViews_abi_cxx11_((string *)local_498,views_02);
                std::__cxx11::string::operator=((string *)info,(string *)local_498);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_498._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_498 + 0x10)) {
                  operator_delete((void *)local_498._0_8_,
                                  CONCAT71(local_498._17_7_,local_498[0x10]) + 1);
                }
              }
              goto LAB_0053adde;
            }
            local_3b8._24_8_ = (arg_pp->_M_dataplus)._M_p;
            local_3b8._16_8_ = arg_pp->_M_string_length;
            local_3b8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x26;
            local_3b8._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
            local_398._M_dataplus._M_p = (pointer)0x12;
            local_398._M_string_length = 0x796a19;
            views_22._M_len = 3;
            views_22._M_array = (iterator)local_3b8;
            cmCatViews_abi_cxx11_((string *)local_468,views_22);
            cmSystemTools::Error((string *)local_468);
LAB_0053c773:
            ppVVar14 = (_Elt_pointer)local_468._16_8_;
            paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_468._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_468 + 0x10)) goto LAB_0053c59a;
            goto LAB_0053c5a2;
          }
LAB_0053adde:
          bVar3 = Json::Value::isMember(local_438,"outputs");
          if (bVar3) {
            pVVar8 = Json::Value::operator[](local_438,"outputs");
            bVar3 = Json::Value::isArray(pVVar8);
            if (bVar3) {
              cVar53 = Json::Value::begin(pVVar8);
              local_3d8._0_8_ = cVar53.super_ValueIteratorBase.current_._M_node;
              local_3d8[8] = cVar53.super_ValueIteratorBase.isNull_;
              cVar53 = Json::Value::end(pVVar8);
              local_3e8.current_ = cVar53.super_ValueIteratorBase.current_._M_node;
              local_3e8.isNull_ = cVar53.super_ValueIteratorBase.isNull_;
              while (bVar3 = Json::ValueIteratorBase::isEqual
                                       ((ValueIteratorBase *)local_3d8,&local_3e8), !bVar3) {
                pVVar8 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_3d8);
                local_498._0_8_ = local_498 + 0x10;
                local_498._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_498[0x10] = '\0';
                bVar3 = ParseFilename(pVVar8,(string *)local_498);
                if (bVar3) {
                  if (((local_410 == '\x01') &&
                      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_430._M_string_length !=
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0)) &&
                     (bVar4 = cmsys::SystemTools::FileIsFullPath((string *)local_498), !bVar4)) {
                    local_468._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x1;
                    local_468._8_8_ = local_468 + 0x10;
                    local_468[0x10] = 0x2f;
                    local_3b8._0_8_ = local_430._M_string_length;
                    local_3b8._8_8_ = local_430._M_dataplus._M_p;
                    local_3b8._16_8_ = (_Elt_pointer)0x1;
                    local_398._M_dataplus._M_p = (pointer)local_498._8_8_;
                    local_398._M_string_length = local_498._0_8_;
                    views_03._M_len = 3;
                    views_03._M_array = (iterator)local_3b8;
                    local_3b8._24_8_ = local_468._8_8_;
                    cmCatViews_abi_cxx11_(&local_408,views_03);
                    std::__cxx11::string::operator=((string *)local_498,(string *)&local_408);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_408._M_dataplus._M_p != &local_408.field_2) {
                      operator_delete(local_408._M_dataplus._M_p,
                                      local_408.field_2._M_allocated_capacity + 1);
                    }
                  }
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string&>
                            (local_290,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_498);
                }
                else {
                  local_3b8._24_8_ = (arg_pp->_M_dataplus)._M_p;
                  local_3b8._16_8_ = arg_pp->_M_string_length;
                  local_3b8._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x26;
                  local_3b8._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                  local_398._M_dataplus._M_p = (pointer)0x12;
                  local_398._M_string_length = 0x796a19;
                  views_04._M_len = 3;
                  views_04._M_array = (iterator)local_3b8;
                  cmCatViews_abi_cxx11_((string *)local_468,views_04);
                  cmSystemTools::Error((string *)local_468);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_468._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_468 + 0x10)) {
                    operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_498._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_498 + 0x10)) {
                  operator_delete((void *)local_498._0_8_,
                                  CONCAT71(local_498._17_7_,local_498[0x10]) + 1);
                }
                if (!bVar3) goto LAB_0053c5a2;
                Json::ValueIteratorBase::increment((ValueIteratorBase *)local_3d8);
              }
            }
          }
          bVar3 = Json::Value::isMember(local_438,"provides");
          if (bVar3) {
            pVVar8 = Json::Value::operator[](local_438,"provides");
            bVar3 = Json::Value::isArray(pVVar8);
            if (!bVar3) {
              local_3b8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x26;
              local_3b8._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
              local_468._8_8_ = (arg_pp->_M_dataplus)._M_p;
              local_468._0_8_ = arg_pp->_M_string_length;
              cmStrCat<char[27]>((string *)local_498,(cmAlphaNum *)local_3b8,(cmAlphaNum *)local_468
                                 ,(char (*) [27])": provides is not an array");
              cmSystemTools::Error((string *)local_498);
              goto LAB_0053c702;
            }
            cVar53 = Json::Value::begin(pVVar8);
            local_3d8._0_8_ = cVar53.super_ValueIteratorBase.current_._M_node;
            local_3d8[8] = cVar53.super_ValueIteratorBase.isNull_;
            cVar53 = Json::Value::end(pVVar8);
            local_3e8.current_ = cVar53.super_ValueIteratorBase.current_._M_node;
            local_3e8.isNull_ = cVar53.super_ValueIteratorBase.isNull_;
            while (bVar3 = Json::ValueIteratorBase::isEqual
                                     ((ValueIteratorBase *)local_3d8,&local_3e8), !bVar3) {
              pVVar8 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_3d8);
              local_3b8._0_8_ = local_3b8 + 0x10;
              local_3b8._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_3b8._16_8_ = local_3b8._16_8_ & 0xffffffffffffff00;
              local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
              local_398._M_string_length = 0;
              local_398.field_2._M_allocated_capacity =
                   local_398.field_2._M_allocated_capacity & 0xffffffffffffff00;
              local_378._0_8_ = local_378 + 0x10;
              local_378._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_378[0x10] = '\0';
              local_358._0_1_ = false;
              local_358._1_1_ = true;
              local_354 = ByName;
              pVVar9 = Json::Value::operator[](pVVar8,"logical-name");
              bVar3 = ParseFilename(pVVar9,(string *)local_3b8);
              if (!bVar3) {
                local_468._24_8_ = (arg_pp->_M_dataplus)._M_p;
                local_468._16_8_ = arg_pp->_M_string_length;
                local_468._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x26;
                local_468._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                local_448 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0xe;
                local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x7969da;
                views_10._M_len = 3;
                views_10._M_array = (iterator)local_468;
                cmCatViews_abi_cxx11_((string *)local_498,views_10);
                cmSystemTools::Error((string *)local_498);
                goto LAB_0053c518;
              }
              bVar3 = Json::Value::isMember(pVVar8,"compiled-module-path");
              if (bVar3) {
                pVVar9 = Json::Value::operator[](pVVar8,"compiled-module-path");
                bVar3 = ParseFilename(pVVar9,(string *)local_378);
                if (!bVar3) {
                  local_468._24_8_ = (arg_pp->_M_dataplus)._M_p;
                  local_468._16_8_ = arg_pp->_M_string_length;
                  local_468._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x26;
                  local_468._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                  local_448 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x12;
                  local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x796a19;
                  views_12._M_len = 3;
                  views_12._M_array = (iterator)local_468;
                  cmCatViews_abi_cxx11_((string *)local_498,views_12);
                  cmSystemTools::Error((string *)local_498);
                  goto LAB_0053c518;
                }
                if (((local_410 == '\x01') &&
                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_430._M_string_length !=
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0)) &&
                   (bVar3 = cmsys::SystemTools::FileIsFullPath((string *)local_378), !bVar3)) {
                  local_498._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x1;
                  local_498._8_8_ = local_498 + 0x10;
                  local_498[0x10] = '/';
                  local_468._0_8_ = local_430._M_string_length;
                  local_468._8_8_ = local_430._M_dataplus._M_p;
                  local_468._16_8_ = (_Elt_pointer)0x1;
                  local_448 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_378._8_8_;
                  local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_378._0_8_;
                  views_05._M_len = 3;
                  views_05._M_array = (iterator)local_468;
                  local_468._24_8_ = local_498._8_8_;
                  cmCatViews_abi_cxx11_(&local_408,views_05);
                  std::__cxx11::string::operator=((string *)local_378,(string *)&local_408);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_408._M_dataplus._M_p != &local_408.field_2) {
                    operator_delete(local_408._M_dataplus._M_p,
                                    local_408.field_2._M_allocated_capacity + 1);
                  }
                }
              }
              bVar3 = Json::Value::isMember(pVVar8,"unique-on-source-path");
              if (bVar3) {
                pVVar9 = Json::Value::operator[](pVVar8,"unique-on-source-path");
                bVar3 = Json::Value::isBool(pVVar9);
                if (!bVar3) {
                  local_468._24_8_ = (arg_pp->_M_dataplus)._M_p;
                  local_468._16_8_ = arg_pp->_M_string_length;
                  local_468._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x26;
                  local_468._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                  local_448 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)&DAT_00000028;
                  local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x796a90;
                  views_13._M_len = 3;
                  views_13._M_array = (iterator)local_468;
                  cmCatViews_abi_cxx11_((string *)local_498,views_13);
                  cmSystemTools::Error((string *)local_498);
                  goto LAB_0053c518;
                }
                bVar3 = Json::Value::asBool(pVVar9);
              }
              else {
                bVar3 = false;
              }
              local_358._0_1_ = bVar3;
              bVar3 = Json::Value::isMember(pVVar8,"source-path");
              if (bVar3) {
                pVVar9 = Json::Value::operator[](pVVar8,"source-path");
                bVar3 = ParseFilename(pVVar9,&local_398);
                if (!bVar3) {
                  local_468._24_8_ = (arg_pp->_M_dataplus)._M_p;
                  local_468._16_8_ = arg_pp->_M_string_length;
                  local_468._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x26;
                  local_468._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                  local_448 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x12;
                  local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x796a19;
                  views_15._M_len = 3;
                  views_15._M_array = (iterator)local_468;
                  cmCatViews_abi_cxx11_((string *)local_498,views_15);
                  cmSystemTools::Error((string *)local_498);
                  goto LAB_0053c518;
                }
                if (((local_410 == '\x01') &&
                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_430._M_string_length !=
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0)) && (bVar3 = cmsys::SystemTools::FileIsFullPath(&local_398), !bVar3)) {
                  local_498._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x1;
                  local_498._8_8_ = local_498 + 0x10;
                  local_498[0x10] = '/';
                  local_468._0_8_ = local_430._M_string_length;
                  local_468._8_8_ = local_430._M_dataplus._M_p;
                  local_468._16_8_ = (_Elt_pointer)0x1;
                  local_448 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_398._M_string_length;
                  local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_398._M_dataplus._M_p;
                  views_06._M_len = 3;
                  views_06._M_array = (iterator)local_468;
                  local_468._24_8_ = local_498._8_8_;
                  cmCatViews_abi_cxx11_(&local_408,views_06);
                  std::__cxx11::string::operator=((string *)&local_398,(string *)&local_408);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_408._M_dataplus._M_p != &local_408.field_2) {
                    operator_delete(local_408._M_dataplus._M_p,
                                    local_408.field_2._M_allocated_capacity + 1);
                  }
                }
              }
              else if (local_358._0_1_ == true) {
                local_468._24_8_ = (arg_pp->_M_dataplus)._M_p;
                local_468._16_8_ = arg_pp->_M_string_length;
                local_468._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x26;
                local_468._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                local_448 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x18;
                local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x796ab9;
                views_14._M_len = 3;
                views_14._M_array = (iterator)local_468;
                cmCatViews_abi_cxx11_((string *)local_498,views_14);
                cmSystemTools::Error((string *)local_498);
                goto LAB_0053c518;
              }
              bVar3 = Json::Value::isMember(pVVar8,"is-interface");
              bVar4 = true;
              if (bVar3) {
                pVVar8 = Json::Value::operator[](pVVar8,"is-interface");
                bVar3 = Json::Value::isBool(pVVar8);
                if (!bVar3) {
                  local_468._24_8_ = (arg_pp->_M_dataplus)._M_p;
                  local_468._16_8_ = arg_pp->_M_string_length;
                  local_468._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x26;
                  local_468._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                  local_448 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x1f;
                  local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x796adf;
                  views_16._M_len = 3;
                  views_16._M_array = (iterator)local_468;
                  cmCatViews_abi_cxx11_((string *)local_498,views_16);
                  cmSystemTools::Error((string *)local_498);
                  goto LAB_0053c518;
                }
                bVar4 = Json::Value::asBool(pVVar8);
              }
              local_358._1_1_ = bVar4;
              std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::push_back
                        (local_288,(value_type *)local_3b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_378._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_378 + 0x10)) {
                operator_delete((void *)local_378._0_8_,
                                CONCAT71(local_378._17_7_,local_378[0x10]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_398._M_dataplus._M_p != &local_398.field_2) {
                operator_delete(local_398._M_dataplus._M_p,
                                (ulong)(local_398.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b8._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_3b8 + 0x10)) {
                operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ + 1);
              }
              Json::ValueIteratorBase::increment((ValueIteratorBase *)local_3d8);
            }
          }
          bVar3 = Json::Value::isMember(local_438,"requires");
          if (bVar3) {
            pVVar8 = Json::Value::operator[](local_438,"requires");
            bVar3 = Json::Value::isArray(pVVar8);
            if (!bVar3) {
              local_3b8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x26;
              local_3b8._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
              local_468._8_8_ = (arg_pp->_M_dataplus)._M_p;
              local_468._0_8_ = arg_pp->_M_string_length;
              cmStrCat<char[27]>((string *)local_498,(cmAlphaNum *)local_3b8,(cmAlphaNum *)local_468
                                 ,(char (*) [27])": requires is not an array");
              cmSystemTools::Error((string *)local_498);
              goto LAB_0053c702;
            }
            cVar53 = Json::Value::begin(pVVar8);
            local_3e8.current_ = cVar53.super_ValueIteratorBase.current_._M_node;
            local_3e8.isNull_ = cVar53.super_ValueIteratorBase.isNull_;
            cVar53 = Json::Value::end(pVVar8);
            local_280.current_ = cVar53.super_ValueIteratorBase.current_._M_node;
            local_280.isNull_ = cVar53.super_ValueIteratorBase.isNull_;
LAB_0053b548:
            bVar3 = Json::ValueIteratorBase::isEqual(&local_3e8,&local_280);
            if (bVar3) goto LAB_0053ba28;
            pVVar8 = Json::ValueIteratorBase::deref(&local_3e8);
            local_3b8._0_8_ = local_3b8 + 0x10;
            local_3b8._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_3b8._16_8_ = local_3b8._16_8_ & 0xffffffffffffff00;
            local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
            local_398._M_string_length = 0;
            local_398.field_2._M_allocated_capacity =
                 local_398.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_378._0_8_ = local_378 + 0x10;
            local_378._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_378[0x10] = '\0';
            local_358._0_1_ = false;
            local_358._1_1_ = true;
            local_354 = ByName;
            pVVar9 = Json::Value::operator[](pVVar8,"logical-name");
            bVar3 = ParseFilename(pVVar9,(string *)local_3b8);
            if (!bVar3) {
              local_468._24_8_ = (arg_pp->_M_dataplus)._M_p;
              local_468._16_8_ = arg_pp->_M_string_length;
              local_468._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x26;
              local_468._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
              local_448 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0xe;
              local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x7969da;
              views_11._M_len = 3;
              views_11._M_array = (iterator)local_468;
              cmCatViews_abi_cxx11_((string *)local_498,views_11);
              cmSystemTools::Error((string *)local_498);
              goto LAB_0053c518;
            }
            bVar3 = Json::Value::isMember(pVVar8,"compiled-module-path");
            if (!bVar3) {
LAB_0053b718:
              bVar3 = Json::Value::isMember(pVVar8,"unique-on-source-path");
              if (bVar3) {
                pVVar9 = Json::Value::operator[](pVVar8,"unique-on-source-path");
                bVar3 = Json::Value::isBool(pVVar9);
                if (!bVar3) {
                  local_468._24_8_ = (arg_pp->_M_dataplus)._M_p;
                  local_468._16_8_ = arg_pp->_M_string_length;
                  local_468._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x26;
                  local_468._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                  local_448 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)&DAT_00000028;
                  local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x796a90;
                  views_18._M_len = 3;
                  views_18._M_array = (iterator)local_468;
                  cmCatViews_abi_cxx11_((string *)local_498,views_18);
                  cmSystemTools::Error((string *)local_498);
                  goto LAB_0053c518;
                }
                bVar3 = Json::Value::asBool(pVVar9);
              }
              else {
                bVar3 = false;
              }
              local_358._0_1_ = bVar3;
              bVar3 = Json::Value::isMember(pVVar8,"source-path");
              if (bVar3) {
                pVVar9 = Json::Value::operator[](pVVar8,"source-path");
                bVar3 = ParseFilename(pVVar9,&local_398);
                if (!bVar3) {
                  local_468._24_8_ = (arg_pp->_M_dataplus)._M_p;
                  local_468._16_8_ = arg_pp->_M_string_length;
                  local_468._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x26;
                  local_468._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                  local_448 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x12;
                  local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x796a19;
                  views_20._M_len = 3;
                  views_20._M_array = (iterator)local_468;
                  cmCatViews_abi_cxx11_((string *)local_498,views_20);
                  cmSystemTools::Error((string *)local_498);
                  goto LAB_0053c518;
                }
                if (((local_410 == '\x01') &&
                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_430._M_string_length !=
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0)) && (bVar3 = cmsys::SystemTools::FileIsFullPath(&local_398), !bVar3)) {
                  local_498._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x1;
                  local_498._8_8_ = local_498 + 0x10;
                  local_498[0x10] = '/';
                  local_468._0_8_ = local_430._M_string_length;
                  local_468._8_8_ = local_430._M_dataplus._M_p;
                  local_468._16_8_ = (_Elt_pointer)0x1;
                  local_448 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_398._M_string_length;
                  local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_398._M_dataplus._M_p;
                  views_08._M_len = 3;
                  views_08._M_array = (iterator)local_468;
                  local_468._24_8_ = local_498._8_8_;
                  cmCatViews_abi_cxx11_(&local_408,views_08);
                  std::__cxx11::string::operator=((string *)&local_398,(string *)&local_408);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_408._M_dataplus._M_p != &local_408.field_2) {
                    operator_delete(local_408._M_dataplus._M_p,
                                    local_408.field_2._M_allocated_capacity + 1);
                  }
                }
              }
              else if (local_358._0_1_ == true) {
                local_468._24_8_ = (arg_pp->_M_dataplus)._M_p;
                local_468._16_8_ = arg_pp->_M_string_length;
                local_468._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x26;
                local_468._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                local_448 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x18;
                local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x796ab9;
                views_19._M_len = 3;
                views_19._M_array = (iterator)local_468;
                cmCatViews_abi_cxx11_((string *)local_498,views_19);
                cmSystemTools::Error((string *)local_498);
                goto LAB_0053c518;
              }
              bVar3 = Json::Value::isMember(pVVar8,"lookup-method");
              if (bVar3) {
                pVVar8 = Json::Value::operator[](pVVar8,"lookup-method");
                bVar3 = Json::Value::isString(pVVar8);
                if (!bVar3) {
                  local_468._24_8_ = (arg_pp->_M_dataplus)._M_p;
                  local_468._16_8_ = arg_pp->_M_string_length;
                  local_468._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x26;
                  local_468._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                  local_448 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x1f;
                  local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x796b1a;
                  views_21._M_len = 3;
                  views_21._M_array = (iterator)local_468;
                  cmCatViews_abi_cxx11_((string *)local_498,views_21);
                  cmSystemTools::Error((string *)local_498);
                  goto LAB_0053c518;
                }
                Json::Value::asString_abi_cxx11_(&local_408,pVVar8);
                if (local_408._M_string_length == 0xd) {
                  if (*(long *)(local_408._M_dataplus._M_p + 5) == 0x656c676e612d6564 &&
                      *(size_type *)local_408._M_dataplus._M_p == 0x2d6564756c636e69) {
                    LVar7 = IncludeAngle;
                  }
                  else {
                    LVar7 = IncludeQuote;
                    if (*(long *)(local_408._M_dataplus._M_p + 5) != 0x65746f75712d6564 ||
                        *(size_type *)local_408._M_dataplus._M_p != 0x2d6564756c636e69)
                    goto LAB_0053c2e5;
                  }
                }
                else if ((local_408._M_string_length != 7) ||
                        (LVar7 = ByName,
                        *(int *)(local_408._M_dataplus._M_p + 3) != 0x656d616e ||
                        *(int *)local_408._M_dataplus._M_p != 0x6e2d7962)) {
LAB_0053c2e5:
                  local_468._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x26;
                  local_468._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
                  local_498._8_8_ = (arg_pp->_M_dataplus)._M_p;
                  local_498._0_8_ = arg_pp->_M_string_length;
                  cmStrCat<char[33],std::__cxx11::string>
                            ((string *)local_3d8,(cmAlphaNum *)local_468,(cmAlphaNum *)local_498,
                             (char (*) [33])": lookup-method is not a valid: ",&local_408);
                  cmSystemTools::Error((string *)local_3d8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3d8._0_8_ != &local_3c8) {
                    operator_delete((void *)local_3d8._0_8_,local_3c8._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_408._M_dataplus._M_p != &local_408.field_2) goto LAB_0053c52b;
                  goto LAB_0053c533;
                }
                local_354 = LVar7;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_408._M_dataplus._M_p != &local_408.field_2) {
                  operator_delete(local_408._M_dataplus._M_p,
                                  local_408.field_2._M_allocated_capacity + 1);
                }
              }
              else if (local_358._0_1_ == true) {
                local_354 = ByName;
              }
              std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::push_back
                        (local_298,(value_type *)local_3b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_378._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_378 + 0x10)) {
                operator_delete((void *)local_378._0_8_,
                                CONCAT71(local_378._17_7_,local_378[0x10]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_398._M_dataplus._M_p != &local_398.field_2) {
                operator_delete(local_398._M_dataplus._M_p,
                                (ulong)(local_398.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b8._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_3b8 + 0x10)) {
                operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ + 1);
              }
              Json::ValueIteratorBase::increment(&local_3e8);
              goto LAB_0053b548;
            }
            pVVar9 = Json::Value::operator[](pVVar8,"compiled-module-path");
            bVar3 = ParseFilename(pVVar9,(string *)local_378);
            if (bVar3) {
              if (((local_410 == '\x01') &&
                  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_430._M_string_length !=
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0)) &&
                 (bVar3 = cmsys::SystemTools::FileIsFullPath((string *)local_378), !bVar3)) {
                local_498._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x1;
                local_498._8_8_ = local_498 + 0x10;
                local_498[0x10] = '/';
                local_468._0_8_ = local_430._M_string_length;
                local_468._8_8_ = local_430._M_dataplus._M_p;
                local_468._16_8_ = (_Elt_pointer)0x1;
                local_448 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_378._8_8_;
                local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_378._0_8_;
                views_07._M_len = 3;
                views_07._M_array = (iterator)local_468;
                local_468._24_8_ = local_498._8_8_;
                cmCatViews_abi_cxx11_(&local_408,views_07);
                std::__cxx11::string::operator=((string *)local_378,(string *)&local_408);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_408._M_dataplus._M_p != &local_408.field_2) {
                  operator_delete(local_408._M_dataplus._M_p,
                                  local_408.field_2._M_allocated_capacity + 1);
                }
              }
              goto LAB_0053b718;
            }
            local_468._24_8_ = (arg_pp->_M_dataplus)._M_p;
            local_468._16_8_ = arg_pp->_M_string_length;
            local_468._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x26;
            local_468._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
            local_448 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x12;
            local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x796a19;
            views_17._M_len = 3;
            views_17._M_array = (iterator)local_468;
            cmCatViews_abi_cxx11_((string *)local_498,views_17);
            cmSystemTools::Error((string *)local_498);
LAB_0053c518:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_498 + 0x10)) {
              local_408.field_2._M_allocated_capacity = CONCAT71(local_498._17_7_,local_498[0x10]);
              local_408._M_dataplus._M_p = (pointer)local_498._0_8_;
LAB_0053c52b:
              operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1
                             );
            }
LAB_0053c533:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_378 + 0x10)) {
              operator_delete((void *)local_378._0_8_,CONCAT71(local_378._17_7_,local_378[0x10]) + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_dataplus._M_p != &local_398.field_2) {
              operator_delete(local_398._M_dataplus._M_p,
                              (ulong)(local_398.field_2._M_allocated_capacity + 1));
            }
            ppVVar14 = (_Elt_pointer)local_3b8._16_8_;
            paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3b8._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8._0_8_ ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_3b8 + 0x10)) goto LAB_0053c5a2;
            goto LAB_0053c59a;
          }
LAB_0053ba28:
          bVar3 = Json::Value::isMember(local_438,"is-interface");
          if (bVar3) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "warning: acknowledging an VS 17.3 toolchain bug; accepting until a new release which fixes it is available"
                       ,0x6a);
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
            std::ostream::put('`');
            std::ostream::flush();
            pVVar8 = Json::Value::operator[](local_438,"is-interface");
            bVar3 = Json::Value::isBool(pVVar8);
            if (!bVar3) {
              local_3b8._24_8_ = (arg_pp->_M_dataplus)._M_p;
              local_3b8._16_8_ = arg_pp->_M_string_length;
              local_3b8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x26;
              local_3b8._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
              local_398._M_dataplus._M_p = (pointer)0x1f;
              local_398._M_string_length = 0x796adf;
              views_23._M_len = 3;
              views_23._M_array = (iterator)local_3b8;
              cmCatViews_abi_cxx11_((string *)local_468,views_23);
              cmSystemTools::Error((string *)local_468);
              goto LAB_0053c773;
            }
            bVar3 = Json::Value::asBool(pVVar8);
            pcVar1 = (info->Provides).
                     super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pcVar2 = (info->Provides).
                     super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (pcVar1 != pcVar2) {
              uVar10 = (long)pcVar2 + (-0x68 - (long)pcVar1);
              auVar21._8_8_ = 0;
              auVar21._0_8_ = uVar10;
              uVar16 = SUB164(auVar21 * ZEXT816(0x4ec4ec4ec4ec4ec5),8);
              uVar18 = (undefined4)(uVar10 / 0x340000000);
              auVar26._0_8_ = CONCAT44(uVar18,uVar16);
              auVar26._8_4_ = uVar16;
              auVar26._12_4_ = uVar18;
              auVar17._0_8_ = auVar26._0_8_ >> 5;
              auVar17._8_8_ = auVar26._8_8_ >> 5;
              pbVar13 = &pcVar1[0xf].IsInterface;
              uVar11 = 0;
              do {
                auVar38._8_4_ = (int)uVar11;
                auVar38._0_8_ = uVar11;
                auVar38._12_4_ = (int)(uVar11 >> 0x20);
                auVar21 = auVar17 ^ _DAT_0073b730;
                auVar26 = (auVar38 | _DAT_0073b720) ^ _DAT_0073b730;
                iVar20 = auVar21._0_4_;
                iVar47 = -(uint)(iVar20 < auVar26._0_4_);
                iVar23 = auVar21._4_4_;
                auVar27._4_4_ = -(uint)(iVar23 < auVar26._4_4_);
                iVar24 = auVar21._8_4_;
                iVar51 = -(uint)(iVar24 < auVar26._8_4_);
                iVar25 = auVar21._12_4_;
                auVar27._12_4_ = -(uint)(iVar25 < auVar26._12_4_);
                auVar40._4_4_ = iVar47;
                auVar40._0_4_ = iVar47;
                auVar40._8_4_ = iVar51;
                auVar40._12_4_ = iVar51;
                auVar21 = pshuflw(in_XMM6,auVar40,0xe8);
                auVar29._4_4_ = -(uint)(auVar26._4_4_ == iVar23);
                auVar29._12_4_ = -(uint)(auVar26._12_4_ == iVar25);
                auVar29._0_4_ = auVar29._4_4_;
                auVar29._8_4_ = auVar29._12_4_;
                auVar52 = pshuflw(in_XMM7,auVar29,0xe8);
                auVar27._0_4_ = auVar27._4_4_;
                auVar27._8_4_ = auVar27._12_4_;
                auVar26 = pshuflw(auVar21,auVar27,0xe8);
                auVar26 = (auVar26 | auVar52 & auVar21) ^ _DAT_00796990;
                auVar26 = packssdw(auVar26,auVar26);
                if ((auVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(bool *)((long)pbVar13 + -0x618) = bVar3;
                }
                auVar27 = auVar29 & auVar40 | auVar27;
                auVar26 = packssdw(auVar27,auVar27);
                auVar26 = packssdw(auVar26 ^ _DAT_00796990,auVar26 ^ _DAT_00796990);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26._0_4_ >> 8 & 1) != 0) {
                  *(bool *)((long)pbVar13 + -0x5b0) = bVar3;
                }
                auVar26 = (auVar38 | _DAT_0073b710) ^ _DAT_0073b730;
                iVar47 = -(uint)(iVar20 < auVar26._0_4_);
                auVar48._4_4_ = -(uint)(iVar23 < auVar26._4_4_);
                iVar51 = -(uint)(iVar24 < auVar26._8_4_);
                auVar48._12_4_ = -(uint)(iVar25 < auVar26._12_4_);
                auVar28._4_4_ = iVar47;
                auVar28._0_4_ = iVar47;
                auVar28._8_4_ = iVar51;
                auVar28._12_4_ = iVar51;
                auVar39._4_4_ = -(uint)(auVar26._4_4_ == iVar23);
                auVar39._12_4_ = -(uint)(auVar26._12_4_ == iVar25);
                auVar39._0_4_ = auVar39._4_4_;
                auVar39._8_4_ = auVar39._12_4_;
                auVar48._0_4_ = auVar48._4_4_;
                auVar48._8_4_ = auVar48._12_4_;
                auVar26 = auVar39 & auVar28 | auVar48;
                auVar26 = packssdw(auVar26,auVar26);
                auVar26 = packssdw(auVar26 ^ _DAT_00796990,auVar26 ^ _DAT_00796990);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26._0_4_ >> 0x10 & 1) != 0) {
                  *(bool *)((long)pbVar13 + -0x548) = bVar3;
                }
                auVar29 = pshufhw(auVar28,auVar28,0x84);
                auVar40 = pshufhw(auVar39,auVar39,0x84);
                auVar27 = pshufhw(auVar29,auVar48,0x84);
                auVar29 = (auVar27 | auVar40 & auVar29) ^ _DAT_00796990;
                auVar29 = packssdw(auVar29,auVar29);
                auVar29 = packsswb(auVar29,auVar29);
                if ((auVar29._0_4_ >> 0x18 & 1) != 0) {
                  *(bool *)((long)pbVar13 + -0x4e0) = bVar3;
                }
                auVar29 = (auVar38 | _DAT_00796980) ^ _DAT_0073b730;
                iVar47 = -(uint)(iVar20 < auVar29._0_4_);
                auVar31._4_4_ = -(uint)(iVar23 < auVar29._4_4_);
                iVar51 = -(uint)(iVar24 < auVar29._8_4_);
                auVar31._12_4_ = -(uint)(iVar25 < auVar29._12_4_);
                auVar41._4_4_ = iVar47;
                auVar41._0_4_ = iVar47;
                auVar41._8_4_ = iVar51;
                auVar41._12_4_ = iVar51;
                auVar26 = pshuflw(auVar26,auVar41,0xe8);
                auVar30._4_4_ = -(uint)(auVar29._4_4_ == iVar23);
                auVar30._12_4_ = -(uint)(auVar29._12_4_ == iVar25);
                auVar30._0_4_ = auVar30._4_4_;
                auVar30._8_4_ = auVar30._12_4_;
                auVar29 = pshuflw(auVar52 & auVar21,auVar30,0xe8);
                auVar31._0_4_ = auVar31._4_4_;
                auVar31._8_4_ = auVar31._12_4_;
                auVar21 = pshuflw(auVar26,auVar31,0xe8);
                auVar21 = (auVar21 | auVar29 & auVar26) ^ _DAT_00796990;
                auVar21 = packssdw(auVar21,auVar21);
                auVar21 = packsswb(auVar21,auVar21);
                if ((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(bool *)((long)pbVar13 + -0x478) = bVar3;
                }
                auVar31 = auVar30 & auVar41 | auVar31;
                auVar21 = packssdw(auVar31,auVar31);
                auVar21 = packssdw(auVar21 ^ _DAT_00796990,auVar21 ^ _DAT_00796990);
                auVar21 = packsswb(auVar21,auVar21);
                if ((auVar21._4_2_ >> 8 & 1) != 0) {
                  *(bool *)((long)pbVar13 + -0x410) = bVar3;
                }
                auVar21 = (auVar38 | _DAT_00796970) ^ _DAT_0073b730;
                iVar47 = -(uint)(iVar20 < auVar21._0_4_);
                auVar49._4_4_ = -(uint)(iVar23 < auVar21._4_4_);
                iVar51 = -(uint)(iVar24 < auVar21._8_4_);
                auVar49._12_4_ = -(uint)(iVar25 < auVar21._12_4_);
                auVar52._4_4_ = iVar47;
                auVar52._0_4_ = iVar47;
                auVar52._8_4_ = iVar51;
                auVar52._12_4_ = iVar51;
                auVar42._4_4_ = -(uint)(auVar21._4_4_ == iVar23);
                auVar42._12_4_ = -(uint)(auVar21._12_4_ == iVar25);
                auVar42._0_4_ = auVar42._4_4_;
                auVar42._8_4_ = auVar42._12_4_;
                auVar49._0_4_ = auVar49._4_4_;
                auVar49._8_4_ = auVar49._12_4_;
                auVar21 = auVar42 & auVar52 | auVar49;
                auVar21 = packssdw(auVar21,auVar21);
                auVar21 = packssdw(auVar21 ^ _DAT_00796990,auVar21 ^ _DAT_00796990);
                auVar21 = packsswb(auVar21,auVar21);
                if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(bool *)((long)pbVar13 + -0x3a8) = bVar3;
                }
                auVar27 = pshufhw(auVar52,auVar52,0x84);
                auVar52 = pshufhw(auVar42,auVar42,0x84);
                auVar40 = pshufhw(auVar27,auVar49,0x84);
                auVar27 = (auVar40 | auVar52 & auVar27) ^ _DAT_00796990;
                auVar27 = packssdw(auVar27,auVar27);
                auVar27 = packsswb(auVar27,auVar27);
                if ((auVar27._6_2_ >> 8 & 1) != 0) {
                  *(bool *)((long)pbVar13 + -0x340) = bVar3;
                }
                auVar27 = (auVar38 | _DAT_00796960) ^ _DAT_0073b730;
                iVar47 = -(uint)(iVar20 < auVar27._0_4_);
                auVar33._4_4_ = -(uint)(iVar23 < auVar27._4_4_);
                iVar51 = -(uint)(iVar24 < auVar27._8_4_);
                auVar33._12_4_ = -(uint)(iVar25 < auVar27._12_4_);
                auVar43._4_4_ = iVar47;
                auVar43._0_4_ = iVar47;
                auVar43._8_4_ = iVar51;
                auVar43._12_4_ = iVar51;
                auVar21 = pshuflw(auVar21,auVar43,0xe8);
                auVar32._4_4_ = -(uint)(auVar27._4_4_ == iVar23);
                auVar32._12_4_ = -(uint)(auVar27._12_4_ == iVar25);
                auVar32._0_4_ = auVar32._4_4_;
                auVar32._8_4_ = auVar32._12_4_;
                auVar29 = pshuflw(auVar29 & auVar26,auVar32,0xe8);
                auVar33._0_4_ = auVar33._4_4_;
                auVar33._8_4_ = auVar33._12_4_;
                auVar26 = pshuflw(auVar21,auVar33,0xe8);
                auVar26 = (auVar26 | auVar29 & auVar21) ^ _DAT_00796990;
                auVar26 = packssdw(auVar26,auVar26);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(bool *)((long)pbVar13 + -0x2d8) = bVar3;
                }
                auVar33 = auVar32 & auVar43 | auVar33;
                auVar26 = packssdw(auVar33,auVar33);
                auVar26 = packssdw(auVar26 ^ _DAT_00796990,auVar26 ^ _DAT_00796990);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26._8_2_ >> 8 & 1) != 0) {
                  *(bool *)((long)pbVar13 + -0x270) = bVar3;
                }
                auVar26 = (auVar38 | _DAT_00796950) ^ _DAT_0073b730;
                iVar47 = -(uint)(iVar20 < auVar26._0_4_);
                auVar50._4_4_ = -(uint)(iVar23 < auVar26._4_4_);
                iVar51 = -(uint)(iVar24 < auVar26._8_4_);
                auVar50._12_4_ = -(uint)(iVar25 < auVar26._12_4_);
                auVar34._4_4_ = iVar47;
                auVar34._0_4_ = iVar47;
                auVar34._8_4_ = iVar51;
                auVar34._12_4_ = iVar51;
                auVar44._4_4_ = -(uint)(auVar26._4_4_ == iVar23);
                auVar44._12_4_ = -(uint)(auVar26._12_4_ == iVar25);
                auVar44._0_4_ = auVar44._4_4_;
                auVar44._8_4_ = auVar44._12_4_;
                auVar50._0_4_ = auVar50._4_4_;
                auVar50._8_4_ = auVar50._12_4_;
                auVar26 = auVar44 & auVar34 | auVar50;
                auVar26 = packssdw(auVar26,auVar26);
                auVar26 = packssdw(auVar26 ^ _DAT_00796990,auVar26 ^ _DAT_00796990);
                auVar26 = packsswb(auVar26,auVar26);
                if ((auVar26 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  *(bool *)((long)pbVar13 + -0x208) = bVar3;
                }
                auVar27 = pshufhw(auVar34,auVar34,0x84);
                auVar52 = pshufhw(auVar44,auVar44,0x84);
                auVar40 = pshufhw(auVar27,auVar50,0x84);
                auVar27 = (auVar40 | auVar52 & auVar27) ^ _DAT_00796990;
                auVar27 = packssdw(auVar27,auVar27);
                auVar27 = packsswb(auVar27,auVar27);
                if ((auVar27._10_2_ >> 8 & 1) != 0) {
                  *(bool *)((long)pbVar13 + -0x1a0) = bVar3;
                }
                auVar27 = (auVar38 | _DAT_00796940) ^ _DAT_0073b730;
                iVar47 = -(uint)(iVar20 < auVar27._0_4_);
                auVar36._4_4_ = -(uint)(iVar23 < auVar27._4_4_);
                iVar51 = -(uint)(iVar24 < auVar27._8_4_);
                auVar36._12_4_ = -(uint)(iVar25 < auVar27._12_4_);
                auVar45._4_4_ = iVar47;
                auVar45._0_4_ = iVar47;
                auVar45._8_4_ = iVar51;
                auVar45._12_4_ = iVar51;
                auVar26 = pshuflw(auVar26,auVar45,0xe8);
                auVar35._4_4_ = -(uint)(auVar27._4_4_ == iVar23);
                auVar35._12_4_ = -(uint)(auVar27._12_4_ == iVar25);
                auVar35._0_4_ = auVar35._4_4_;
                auVar35._8_4_ = auVar35._12_4_;
                in_XMM7 = pshuflw(auVar29 & auVar21,auVar35,0xe8);
                in_XMM7 = in_XMM7 & auVar26;
                auVar36._0_4_ = auVar36._4_4_;
                auVar36._8_4_ = auVar36._12_4_;
                auVar21 = pshuflw(auVar26,auVar36,0xe8);
                auVar21 = (auVar21 | in_XMM7) ^ _DAT_00796990;
                auVar21 = packssdw(auVar21,auVar21);
                in_XMM6 = packsswb(auVar21,auVar21);
                if ((in_XMM6 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(bool *)((long)pbVar13 + -0x138) = bVar3;
                }
                auVar36 = auVar35 & auVar45 | auVar36;
                auVar21 = packssdw(auVar36,auVar36);
                auVar21 = packssdw(auVar21 ^ _DAT_00796990,auVar21 ^ _DAT_00796990);
                auVar21 = packsswb(auVar21,auVar21);
                if ((auVar21._12_2_ >> 8 & 1) != 0) {
                  *(bool *)((long)pbVar13 + -0xd0) = bVar3;
                }
                auVar21 = (auVar38 | _DAT_00796930) ^ _DAT_0073b730;
                auVar46._0_4_ = -(uint)(iVar20 < auVar21._0_4_);
                auVar46._4_4_ = -(uint)(iVar23 < auVar21._4_4_);
                auVar46._8_4_ = -(uint)(iVar24 < auVar21._8_4_);
                auVar46._12_4_ = -(uint)(iVar25 < auVar21._12_4_);
                auVar37._4_4_ = auVar46._0_4_;
                auVar37._0_4_ = auVar46._0_4_;
                auVar37._8_4_ = auVar46._8_4_;
                auVar37._12_4_ = auVar46._8_4_;
                auVar19._4_4_ = -(uint)(auVar21._4_4_ == iVar23);
                auVar19._12_4_ = -(uint)(auVar21._12_4_ == iVar25);
                auVar19._0_4_ = auVar19._4_4_;
                auVar19._8_4_ = auVar19._12_4_;
                auVar22._4_4_ = auVar46._4_4_;
                auVar22._0_4_ = auVar46._4_4_;
                auVar22._8_4_ = auVar46._12_4_;
                auVar22._12_4_ = auVar46._12_4_;
                auVar21 = packssdw(auVar46,auVar19 & auVar37 | auVar22);
                auVar21 = packssdw(auVar21 ^ _DAT_00796990,auVar21 ^ _DAT_00796990);
                auVar21 = packsswb(auVar21,auVar21);
                if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(bool *)((long)pbVar13 + -0x68) = bVar3;
                }
                auVar38 = pshufhw(auVar37,auVar37,0x84);
                auVar21 = pshufhw(auVar19,auVar19,0x84);
                auVar26 = pshufhw(auVar22,auVar22,0x84);
                auVar21 = packssdw(auVar21 & auVar38,(auVar26 | auVar21 & auVar38) ^ _DAT_00796990);
                auVar21 = packsswb(auVar21,auVar21);
                if ((auVar21._14_2_ >> 8 & 1) != 0) {
                  *pbVar13 = bVar3;
                }
                uVar11 = uVar11 + 0x10;
                pbVar13 = pbVar13 + 0x680;
              } while ((uVar10 / 0x68 + 0x10 & 0xfffffffffffffff0) != uVar11);
            }
          }
          if ((local_410 == '\x01') &&
             (local_410 = '\0',
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_430._M_dataplus._M_p != &local_430.field_2)) {
            operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
          }
          Json::ValueIteratorBase::increment(&local_2a8);
        }
        goto LAB_0053aad6;
      }
      local_3b8._24_8_ = (arg_pp->_M_dataplus)._M_p;
      local_3b8._16_8_ = arg_pp->_M_string_length;
      local_3b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x26;
      local_3b8._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
      local_398._M_dataplus._M_p = (pointer)0x19;
      local_398._M_string_length = 0x7969b1;
      views_09._M_len = 3;
      views_09._M_array = (iterator)local_3b8;
      cmCatViews_abi_cxx11_((string *)local_468,views_09);
      cmSystemTools::Error((string *)local_468);
      local_430.field_2._M_allocated_capacity = local_468._16_8_;
      local_430._M_dataplus._M_p = (pointer)local_468._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_468 + 0x10)) goto LAB_0053a9d6;
    }
    else {
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(arg_pp->_M_dataplus)._M_p;
      ppVVar14 = (_Elt_pointer)arg_pp->_M_string_length;
      Json::Value::asString_abi_cxx11_((String *)local_498,pVVar8);
      local_3b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x26;
      local_3b8._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
      local_398._M_dataplus._M_p = (pointer)0xa;
      local_398._M_string_length = 0x7969a0;
      local_398.field_2._M_allocated_capacity = local_498._8_8_;
      local_398.field_2._8_8_ = local_498._0_8_;
      views._M_len = 4;
      views._M_array = (iterator)local_3b8;
      local_3b8._16_8_ = ppVVar14;
      local_3b8._24_8_ = paVar15;
      cmCatViews_abi_cxx11_((string *)local_468,views);
      cmSystemTools::Error((string *)local_468);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_468 + 0x10)) {
        operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_498 + 0x10)) {
        local_430.field_2._M_allocated_capacity =
             (size_type)(_Elt_pointer)CONCAT71(local_498._17_7_,local_498[0x10]);
        local_430._M_dataplus._M_p = (pointer)local_498._0_8_;
LAB_0053a9d6:
        operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(arg_pp->_M_dataplus)._M_p;
    ppVVar14 = (_Elt_pointer)arg_pp->_M_string_length;
    Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_430,(Reader *)local_3b8);
    local_468._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x26;
    local_468._8_8_ = "-E cmake_ninja_dyndep failed to parse ";
    local_448 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_430._M_string_length;
    local_440 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_430._M_dataplus._M_p;
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_468;
    local_468._16_8_ = ppVVar14;
    local_468._24_8_ = paVar15;
    cmCatViews_abi_cxx11_((string *)local_498,views_00);
    cmSystemTools::Error((string *)local_498);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_498 + 0x10)) {
      operator_delete((void *)local_498._0_8_,CONCAT71(local_498._17_7_,local_498[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_p != &local_2c0) {
      operator_delete(local_2d0._M_p,local_2c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_p != local_308) {
      operator_delete(local_318._M_p,local_308[0]._M_allocated_capacity + 1);
    }
    std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
              ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)
               (local_378 + 0x10));
    std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
              ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)local_3b8);
  }
LAB_0053aad4:
  bVar12 = false;
LAB_0053aad6:
  std::ifstream::~ifstream(local_238);
  Json::Value::~Value(&local_270);
  return bVar12;
}

Assistant:

bool cmScanDepFormat_P1689_Parse(std::string const& arg_pp,
                                 cmScanDepInfo* info)
{
  Json::Value ppio;
  Json::Value const& ppi = ppio;
  cmsys::ifstream ppf(arg_pp.c_str(), std::ios::in | std::ios::binary);
  {
    Json::Reader reader;
    if (!reader.parse(ppf, ppio, false)) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                    arg_pp,
                                    reader.getFormattedErrorMessages()));
      return false;
    }
  }

  Json::Value const& version = ppi["version"];
  if (version.asUInt() > 1) {
    cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                  arg_pp, ": version ", version.asString()));
    return false;
  }

  Json::Value const& rules = ppi["rules"];
  if (rules.isArray()) {
    if (rules.size() != 1) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                    arg_pp, ": expected 1 source entry"));
      return false;
    }

    for (auto const& rule : rules) {
      cm::optional<std::string> work_directory;
      Json::Value const& workdir = rule["work-directory"];
      if (workdir.isString()) {
        std::string wd;
        PARSE_BLOB(workdir, wd);
        work_directory = std::move(wd);
      } else if (!workdir.isNull()) {
        cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                      arg_pp,
                                      ": work-directory is not a string"));
        return false;
      }

      if (rule.isMember("primary-output")) {
        Json::Value const& primary_output = rule["primary-output"];
        PARSE_FILENAME(primary_output, info->PrimaryOutput);
      }

      if (rule.isMember("outputs")) {
        Json::Value const& outputs = rule["outputs"];
        if (outputs.isArray()) {
          for (auto const& output : outputs) {
            std::string extra_output;
            PARSE_FILENAME(output, extra_output);

            info->ExtraOutputs.emplace_back(extra_output);
          }
        }
      }

      if (rule.isMember("provides")) {
        Json::Value const& provides = rule["provides"];
        if (!provides.isArray()) {
          cmSystemTools::Error(
            cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                     ": provides is not an array"));
          return false;
        }

        for (auto const& provide : provides) {
          cmSourceReqInfo provide_info;

          Json::Value const& logical_name = provide["logical-name"];
          PARSE_BLOB(logical_name, provide_info.LogicalName);

          if (provide.isMember("compiled-module-path")) {
            Json::Value const& compiled_module_path =
              provide["compiled-module-path"];
            PARSE_FILENAME(compiled_module_path,
                           provide_info.CompiledModulePath);
          }

          if (provide.isMember("unique-on-source-path")) {
            Json::Value const& unique_on_source_path =
              provide["unique-on-source-path"];
            if (!unique_on_source_path.isBool()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": unique-on-source-path is not a boolean"));
              return false;
            }
            provide_info.UseSourcePath = unique_on_source_path.asBool();
          } else {
            provide_info.UseSourcePath = false;
          }

          if (provide.isMember("source-path")) {
            Json::Value const& source_path = provide["source-path"];
            PARSE_FILENAME(source_path, provide_info.SourcePath);
          } else if (provide_info.UseSourcePath) {
            cmSystemTools::Error(
              cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                       ": source-path is missing"));
            return false;
          }

          if (provide.isMember("is-interface")) {
            Json::Value const& is_interface = provide["is-interface"];
            if (!is_interface.isBool()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": is-interface is not a boolean"));
              return false;
            }
            provide_info.IsInterface = is_interface.asBool();
          } else {
            provide_info.IsInterface = true;
          }

          info->Provides.push_back(provide_info);
        }
      }

      if (rule.isMember("requires")) {
        Json::Value const& reqs = rule["requires"];
        if (!reqs.isArray()) {
          cmSystemTools::Error(
            cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                     ": requires is not an array"));
          return false;
        }

        for (auto const& require : reqs) {
          cmSourceReqInfo require_info;

          Json::Value const& logical_name = require["logical-name"];
          PARSE_BLOB(logical_name, require_info.LogicalName);

          if (require.isMember("compiled-module-path")) {
            Json::Value const& compiled_module_path =
              require["compiled-module-path"];
            PARSE_FILENAME(compiled_module_path,
                           require_info.CompiledModulePath);
          }

          if (require.isMember("unique-on-source-path")) {
            Json::Value const& unique_on_source_path =
              require["unique-on-source-path"];
            if (!unique_on_source_path.isBool()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": unique-on-source-path is not a boolean"));
              return false;
            }
            require_info.UseSourcePath = unique_on_source_path.asBool();
          } else {
            require_info.UseSourcePath = false;
          }

          if (require.isMember("source-path")) {
            Json::Value const& source_path = require["source-path"];
            PARSE_FILENAME(source_path, require_info.SourcePath);
          } else if (require_info.UseSourcePath) {
            cmSystemTools::Error(
              cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                       ": source-path is missing"));
            return false;
          }

          if (require.isMember("lookup-method")) {
            Json::Value const& lookup_method = require["lookup-method"];
            if (!lookup_method.isString()) {
              cmSystemTools::Error(
                cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                         ": lookup-method is not a string"));
              return false;
            }

            std::string lookup_method_str = lookup_method.asString();
            if (lookup_method_str == "by-name"_s) {
              require_info.Method = LookupMethod::ByName;
            } else if (lookup_method_str == "include-angle"_s) {
              require_info.Method = LookupMethod::IncludeAngle;
            } else if (lookup_method_str == "include-quote"_s) {
              require_info.Method = LookupMethod::IncludeQuote;
            } else {
              cmSystemTools::Error(cmStrCat(
                "-E cmake_ninja_dyndep failed to parse ", arg_pp,
                ": lookup-method is not a valid: ", lookup_method_str));
              return false;
            }
          } else if (require_info.UseSourcePath) {
            require_info.Method = LookupMethod::ByName;
          }

          info->Requires.push_back(require_info);
        }
      }

      // MSVC 17.3 toolchain bug. Remove when 17.4 is available.
      if (rule.isMember("is-interface")) {
        std::cerr
          << "warning: acknowledging an VS 17.3 toolchain bug; accepting "
             "until a new release which fixes it is available"
          << std::endl;

        Json::Value const& is_interface_json = rule["is-interface"];
        if (!is_interface_json.isBool()) {
          cmSystemTools::Error(
            cmStrCat("-E cmake_ninja_dyndep failed to parse ", arg_pp,
                     ": is-interface is not a boolean"));
          return false;
        }
        bool is_interface = is_interface_json.asBool();

        for (auto& provide : info->Provides) {
          provide.IsInterface = is_interface;
        }
      }
    }
  }

  return true;
}